

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

bool __thiscall trun::TestRunner::ExecuteMainExit(TestRunner *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  kTestResult kVar2;
  Config *pCVar3;
  element_type *dynlib;
  ResultSummary *this_01;
  element_type *peVar4;
  shared_ptr<trun::TestFunc> local_b8;
  undefined8 local_a8;
  CBPrePostHook local_a0;
  CBPrePostHook local_98 [2];
  undefined1 local_88 [8];
  Ref result;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Ref dummy;
  bool bRes;
  TestRunner *this_local;
  
  dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1
  ;
  pCVar3 = Config::Instance();
  if ((pCVar3->testGlobalMain & 1U) == 0) {
    return (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._7_1_ & 1);
  }
  bVar1 = std::operator==(&this->globalExit,(nullptr_t)0x0);
  if (bVar1) {
    return (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._7_1_ & 1);
  }
  gnilk::Log::Info<char_const*>(this->pLogger,"Executing Global Exit");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"_dummy-main_",&local_51);
  TestModule::Create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  this_00 = &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<trun::TestModule>::shared_ptr
            ((shared_ptr<trun::TestModule> *)this_00,(shared_ptr<trun::TestModule> *)local_30);
  SetCurrentTestModule((Ref *)this_00);
  std::shared_ptr<trun::TestModule>::~shared_ptr
            ((shared_ptr<trun::TestModule> *)
             &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  dynlib = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->globalExit);
  std::shared_ptr<trun::IDynLibrary>::shared_ptr
            ((shared_ptr<trun::IDynLibrary> *)local_98,&this->library);
  local_a0.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
  local_a8 = 0;
  TestFunc::Execute((TestFunc *)local_88,(Ref *)dynlib,local_98,&local_a0);
  std::shared_ptr<trun::IDynLibrary>::~shared_ptr((shared_ptr<trun::IDynLibrary> *)local_98);
  this_01 = ResultSummary::Instance();
  std::shared_ptr<trun::TestFunc>::shared_ptr(&local_b8,&this->globalExit);
  ResultSummary::AddResult(this_01,&local_b8);
  std::shared_ptr<trun::TestFunc>::~shared_ptr(&local_b8);
  peVar4 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  kVar2 = TestResult::Result(peVar4);
  if (kVar2 != kTestResult_AllFail) {
    peVar4 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    kVar2 = TestResult::Result(peVar4);
    if (kVar2 != kTestResult_TestFail) goto LAB_0015f29a;
  }
  pCVar3 = Config::Instance();
  if ((pCVar3->stopOnAllFail & 1U) != 0) {
    gnilk::Log::Info<char_const*>(this->pLogger,"Total test failure, aborting");
    dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         0;
  }
LAB_0015f29a:
  gnilk::Log::Info<char_const*>(this->pLogger,"Done: test main exit\n\n");
  bVar1 = (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._7_1_ & 1);
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_88);
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_30);
  return bVar1;
}

Assistant:

bool TestRunner::ExecuteMainExit() {

    bool bRes = true;
    if (!Config::Instance().testGlobalMain) {
        return bRes;
    }
    if (globalExit == nullptr) {
        return bRes;
    }

    pLogger->Info("Executing Global Exit");

    // Create dummy module (see: ExecuteMain for expl.)
    auto dummy = TestModule::Create("_dummy-main_");
    SetCurrentTestModule(dummy);

    TestResult::Ref result = globalExit->Execute(library, {}, {});
    ResultSummary::Instance().AddResult(globalExit);

    if ((result->Result() == kTestResult_AllFail) || (result->Result() == kTestResult_TestFail)) {
        if (Config::Instance().stopOnAllFail) {
            pLogger->Info("Total test failure, aborting");
            bRes = false;
        }
    }

    pLogger->Info("Done: test main exit\n\n");
    return bRes;

}